

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O2

void __thiscall
CTxMemPoolEntry::CTxMemPoolEntry
          (CTxMemPoolEntry *this,CTransactionRef *tx,CAmount fee,int64_t time,uint entry_height,
          uint64_t entry_sequence,bool spends_coinbase,int64_t sigops_cost,LockPoints lp)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pvVar6;
  pointer puVar7;
  pointer puVar8;
  int32_t iVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  pointer pvVar13;
  const_iterator it;
  pointer pCVar14;
  long lVar15;
  pointer pCVar16;
  long lVar17;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_58;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_48;
  long local_38;
  ulong uVar18;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this,
             &tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  p_Var1 = &(this->m_parents)._M_t._M_impl.super__Rb_tree_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_children)._M_t._M_impl.super__Rb_tree_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nFee = fee;
  peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.m_params = &::TX_NO_WITNESS;
  local_48.m_object = peVar2;
  sVar10 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>(&local_48);
  local_58.m_params = &::TX_WITH_WITNESS;
  local_58.m_object = peVar2;
  sVar11 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>(&local_58);
  this->nTxWeight = (int)sVar11 + (int)sVar10 * 3;
  peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    sVar10 = 0;
  }
  else {
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pCVar16 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar4 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar12 = (long)pCVar3 + (0x1f - (long)pCVar16) & 0xfffffffffffffff0;
    if (pCVar3 == pCVar16) {
      uVar12 = 0;
    }
    pCVar14 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar18 = (long)pCVar4 + (0x1f - (long)pCVar14) & 0xfffffffffffffff0;
    if (pCVar4 == pCVar14) {
      uVar18 = 0;
    }
    lVar17 = uVar18 + uVar12;
    for (; pCVar14 != pCVar5; pCVar14 = pCVar14 + 1) {
      sVar10 = RecursiveDynamicUsage(&pCVar14->scriptSig);
      pvVar6 = *(pointer *)
                ((long)&(pCVar14->scriptWitness).stack.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
      pvVar13 = (pCVar14->scriptWitness).stack.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = 0;
      if (pvVar6 != pvVar13) {
        uVar12 = (long)pvVar6 + (0x1f - (long)pvVar13) & 0xfffffffffffffff0;
      }
      lVar15 = uVar12 + sVar10;
      for (; pvVar13 !=
             *(pointer *)
              ((long)&(pCVar14->scriptWitness).stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8); pvVar13 = pvVar13 + 1) {
        puVar7 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar8 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = 0;
        if (puVar7 != puVar8) {
          uVar12 = (ulong)(puVar7 + (0x1f - (long)puVar8)) & 0xfffffffffffffff0;
        }
        lVar15 = lVar15 + uVar12;
      }
      lVar17 = lVar17 + lVar15;
    }
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; pCVar16 != pCVar3; pCVar16 = pCVar16 + 1) {
      sVar10 = RecursiveDynamicUsage(&pCVar16->scriptPubKey);
      lVar17 = lVar17 + sVar10;
    }
    sVar10 = lVar17 + 0xc0;
  }
  this->nUsageSize = sVar10;
  this->nTime = time;
  this->entry_sequence = entry_sequence;
  this->entryHeight = entry_height;
  this->spendsCoinbase = spends_coinbase;
  this->sigOpCost = sigops_cost;
  this->m_modified_fee = this->nFee;
  (this->lockPoints).height = lp.height;
  *(undefined4 *)&(this->lockPoints).field_0x4 = lp._4_4_;
  (this->lockPoints).time = lp.time;
  (this->lockPoints).maxInputBlock = lp.maxInputBlock;
  this->m_count_with_descendants = 1;
  iVar9 = GetTxSize(this);
  this->nSizeWithDescendants = (long)iVar9;
  this->nModFeesWithDescendants = this->nFee;
  this->m_count_with_ancestors = 1;
  iVar9 = GetTxSize(this);
  this->nSizeWithAncestors = (long)iVar9;
  this->nModFeesWithAncestors = this->nFee;
  this->nSigOpCostWithAncestors = this->sigOpCost;
  (this->m_epoch_marker).m_marker = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPoolEntry(const CTransactionRef& tx, CAmount fee,
                    int64_t time, unsigned int entry_height, uint64_t entry_sequence,
                    bool spends_coinbase,
                    int64_t sigops_cost, LockPoints lp)
        : tx{tx},
          nFee{fee},
          nTxWeight{GetTransactionWeight(*tx)},
          nUsageSize{RecursiveDynamicUsage(tx)},
          nTime{time},
          entry_sequence{entry_sequence},
          entryHeight{entry_height},
          spendsCoinbase{spends_coinbase},
          sigOpCost{sigops_cost},
          m_modified_fee{nFee},
          lockPoints{lp},
          nSizeWithDescendants{GetTxSize()},
          nModFeesWithDescendants{nFee},
          nSizeWithAncestors{GetTxSize()},
          nModFeesWithAncestors{nFee},
          nSigOpCostWithAncestors{sigOpCost} {}